

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::SplitTxOut(JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::SplitTxOutRequestStruct_&)>
  local_58;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::SplitTxOutRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::SplitTxOutRequestStruct_const&)>
  ::
  function<cfd::js::api::RawTransactionResponseStruct(&)(cfd::js::api::SplitTxOutRequestStruct_const&),void>
            ((function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::SplitTxOutRequestStruct_const&)>
              *)&local_38,TransactionStructApi::SplitTxOut);
  std::
  function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::SplitTxOutRequestStruct_const&)>
  ::
  function<cfd::js::api::RawTransactionResponseStruct(&)(cfd::js::api::SplitTxOutRequestStruct_const&),void>
            ((function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::SplitTxOutRequestStruct_const&)>
              *)&local_58,ElementsTransactionStructApi::SplitTxOut);
  ExecuteElementsCheckApi<cfd::js::api::json::SplitTxOutRequest,cfd::js::api::json::RawTransactionResponse,cfd::js::api::SplitTxOutRequestStruct,cfd::js::api::RawTransactionResponseStruct>
            ((json *)this,request_message,&local_38,&local_58);
  std::
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::SplitTxOutRequestStruct_&)>
  ::~function(&local_58);
  std::
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::SplitTxOutRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::SplitTxOut(const std::string &request_message) {
  return ExecuteElementsCheckApi<
      api::json::SplitTxOutRequest, api::json::RawTransactionResponse,
      api::SplitTxOutRequestStruct, api::RawTransactionResponseStruct>(
      request_message, TransactionStructApi::SplitTxOut,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsTransactionStructApi::SplitTxOut);
#else
      TransactionStructApi::SplitTxOut);
#endif
}